

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O2

void __thiscall QStackedLayout::setCurrentIndex(QStackedLayout *this,int index)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  FocusPolicy FVar4;
  QWidget *pQVar5;
  QWidget *this_00;
  QWidget *this_01;
  QWidget *pQVar6;
  QWidget *pQVar7;
  int __sig;
  long in_FS_OFFSET;
  bool bVar8;
  QWeakPointer<QObject> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QLayout).field_0x8;
  pQVar5 = currentWidget(this);
  this_00 = widget(this,index);
  if (this_00 == pQVar5 || this_00 == (QWidget *)0x0) goto LAB_002e9ea1;
  this_01 = QLayout::parentWidget(&this->super_QLayout);
  if (this_01 == (QWidget *)0x0) {
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    bVar8 = false;
    pQVar6 = (QWidget *)0x0;
  }
  else {
    bVar8 = (this_01->data->widget_attributes & 0x400) == 0;
    if (bVar8) {
      QWidget::setUpdatesEnabled(this_01,false);
    }
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar6 = QWidget::window(this_01);
    pQVar6 = QWidget::focusWidget(pQVar6);
  }
  QPointer<QWidget>::QPointer<void>((QPointer<QWidget> *)&local_48,pQVar6);
  __sig = (int)pQVar6;
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)&local_48);
  if (pQVar5 == (QWidget *)0x0 || !bVar2) {
    bVar2 = false;
    bVar3 = false;
    if (pQVar5 != (QWidget *)0x0) goto LAB_002e9e27;
  }
  else {
    if ((local_48.d == (Data *)0x0) ||
       (pQVar6 = (QWidget *)local_48.value, *(int *)(local_48.d + 4) == 0)) {
      pQVar6 = (QWidget *)0x0;
    }
    bVar3 = QWidget::isAncestorOf(pQVar5,pQVar6);
    __sig = (int)pQVar6;
LAB_002e9e27:
    QWidget::clearFocus(pQVar5);
    bVar2 = bVar3;
    if (*(int *)(lVar1 + 0xcc) == 0) {
      QWidget::hide(pQVar5);
    }
  }
  *(int *)(lVar1 + 200) = index;
  QWidget::raise(this_00,__sig);
  QWidget::show(this_00);
  if ((this_01 != (QWidget *)0x0) && (bVar2 != false)) {
    pQVar5 = QWidget::focusWidget(this_00);
    if (pQVar5 == (QWidget *)0x0) {
      if (((local_48.d != (Data *)0x0) && (*(int *)(local_48.d + 4) != 0)) &&
         (pQVar6 = (QWidget *)local_48.value, (QWidget *)local_48.value != (QWidget *)0x0)) {
        do {
          pQVar6 = QWidget::nextInFocusChain(pQVar6);
          if ((local_48.d == (Data *)0x0) ||
             (pQVar5 = (QWidget *)local_48.value, *(int *)(local_48.d + 4) == 0)) {
            pQVar5 = (QWidget *)0x0;
          }
          if (pQVar5 == pQVar6) goto LAB_002e9f57;
          FVar4 = QWidget::focusPolicy(pQVar6);
        } while ((((FVar4 & TabFocus) == NoFocus) ||
                 (pQVar5 = QWidget::focusProxy(pQVar6), pQVar5 != (QWidget *)0x0)) ||
                ((bVar2 = QWidget::isVisibleTo(pQVar6,this_00), !bVar2 ||
                 (((pQVar6->data->widget_attributes & 1) != 0 ||
                  (bVar2 = QWidget::isAncestorOf(this_00,pQVar6), !bVar2))))));
        QWidget::setFocus(pQVar6);
LAB_002e9f57:
        if ((local_48.d == (Data *)0x0) ||
           (pQVar7 = (QWidget *)local_48.value, *(int *)(local_48.d + 4) == 0)) {
          pQVar7 = (QWidget *)0x0;
        }
        pQVar5 = this_00;
        if (pQVar7 == pQVar6) goto LAB_002e9e72;
      }
    }
    else {
LAB_002e9e72:
      QWidget::setFocus(pQVar5);
    }
  }
  if (bVar8) {
    QWidget::setUpdatesEnabled(this_01,true);
  }
  currentChanged(this,index);
  QWeakPointer<QObject>::~QWeakPointer(&local_48);
LAB_002e9ea1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStackedLayout::setCurrentIndex(int index)
{
    Q_D(QStackedLayout);
    QWidget *prev = currentWidget();
    QWidget *next = widget(index);
    if (!next || next == prev)
        return;

    bool reenableUpdates = false;
    QWidget *parent = parentWidget();

    if (parent && parent->updatesEnabled()) {
        reenableUpdates = true;
        parent->setUpdatesEnabled(false);
    }

    QPointer<QWidget> fw = parent ? parent->window()->focusWidget() : nullptr;
    const bool focusWasOnOldPage = fw && (prev && prev->isAncestorOf(fw));

    if (prev) {
        prev->clearFocus();
        if (d->stackingMode == StackOne)
            prev->hide();
    }

    d->index = index;
    next->raise();
    next->show();

    // try to move focus onto the incoming widget if focus
    // was somewhere on the outgoing widget.

    if (parent) {
        if (focusWasOnOldPage) {
            // look for the best focus widget we can find
            if (QWidget *nfw = next->focusWidget())
                nfw->setFocus();
            else {
                // second best: first child widget in the focus chain
                if (QWidget *i = fw) {
                    while ((i = i->nextInFocusChain()) != fw) {
                        if (((i->focusPolicy() & Qt::TabFocus) == Qt::TabFocus)
                            && !i->focusProxy() && i->isVisibleTo(next) && i->isEnabled()
                            && next->isAncestorOf(i)) {
                            i->setFocus();
                            break;
                        }
                    }
                    // third best: incoming widget
                    if (i == fw )
                        next->setFocus();
                }
            }
        }
    }
    if (reenableUpdates)
        parent->setUpdatesEnabled(true);
    emit currentChanged(index);
}